

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O1

void __thiscall FMultiPatchTexture::TexPart::TexPart(TexPart *this)

{
  this->OriginX = 0;
  this->OriginY = 0;
  this->Rotate = '\0';
  this->op = '\0';
  this->Texture = (FTexture *)0x0;
  this->Translation = (FRemapTable *)0x0;
  (this->Blend).field_0.d = 0;
  this->Alpha = 0x10000;
  return;
}

Assistant:

FMultiPatchTexture::TexPart::TexPart()
{
	OriginX = OriginY = 0;
	Rotate = 0;
	Texture = NULL;
	Translation = NULL;
	Blend = 0;
	Alpha = FRACUNIT;
	op = OP_COPY;
}